

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

void BrotliCreateZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
               Hasher *hasher,int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals)

{
  ZopfliNode *nodes;
  anon_union_4_3_cc401a1e_for_u *paVar1;
  size_t sVar2;
  size_t *psVar3;
  long lVar4;
  
  lVar4 = num_bytes + 1;
  psVar3 = num_commands;
  if (lVar4 == 0) {
    nodes = (ZopfliNode *)0x0;
  }
  else {
    nodes = (ZopfliNode *)BrotliAllocate(m,lVar4 * 0x10);
    paVar1 = &nodes->u;
    do {
      ((ZopfliNode *)(paVar1 + -3))->length = 1;
      ((ZopfliNode *)(paVar1 + -3))->distance = 0;
      *(undefined8 *)(paVar1 + -1) = 0x7effc99e00000000;
      paVar1 = paVar1 + 4;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  sVar2 = BrotliZopfliComputeShortestPath
                    (m,num_bytes,position,ringbuffer,ringbuffer_mask,(ContextLut)psVar3,params,
                     dist_cache,hasher,nodes);
  *num_commands = *num_commands + sVar2;
  BrotliZopfliCreateCommands
            (num_bytes,position,nodes,dist_cache,last_insert_len,params,commands,num_literals);
  BrotliFree(m,nodes);
  return;
}

Assistant:

void BrotliCreateZopfliBackwardReferences(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  ZopfliNode* nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(nodes)) return;
  BrotliInitZopfliNodes(nodes, num_bytes + 1);
  *num_commands += BrotliZopfliComputeShortestPath(m, num_bytes,
      position, ringbuffer, ringbuffer_mask, literal_context_lut, params,
      dist_cache, hasher, nodes);
  if (BROTLI_IS_OOM(m)) return;
  BrotliZopfliCreateCommands(num_bytes, position, nodes, dist_cache,
      last_insert_len, params, commands, num_literals);
  BROTLI_FREE(m, nodes);
}